

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

HTMLElement * __thiscall
soul::HTMLGenerator::printExpression(HTMLGenerator *this,HTMLElement *parent,Expression *e)

{
  bool bVar1;
  ulong uVar2;
  HTMLElement *pHVar3;
  string_view sVar4;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string_view local_60;
  char *local_50;
  char *classID;
  Section *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  *__range2;
  Expression *pEStack_20;
  anon_class_1_0_00000001 getClassForTypeSection;
  Expression *e_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  pEStack_20 = e;
  __end2 = std::
           vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ::begin(&e->sections);
  s = (Section *)
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::end(&e->sections);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
                                *)&s);
    if (!bVar1) {
      return parent;
    }
    classID = (char *)__gnu_cxx::
                      __normal_iterator<const_soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
                      ::operator*(&__end2);
    local_50 = printExpression::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&__range2 + 7),
                          ((reference)classID)->type);
    if (*(int *)classID == 2) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) goto LAB_00516f93;
      std::operator+(&local_80,"#",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (classID + 0x28));
      sVar4 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_80);
      local_60 = sVar4;
      pHVar3 = choc::html::HTMLElement::addLink(parent,sVar4);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_a0,local_50);
      pHVar3 = choc::html::HTMLElement::setClass(pHVar3,local_a0[0]);
      sVar4 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(classID + 8));
      local_b0 = sVar4;
      choc::html::HTMLElement::addContent(pHVar3,sVar4);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
LAB_00516f93:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,local_50);
      pHVar3 = choc::html::HTMLElement::addSpan(parent,local_c0);
      sVar4 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(classID + 8));
      choc::html::HTMLElement::addContent(pHVar3,sVar4);
    }
    __gnu_cxx::
    __normal_iterator<const_soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

choc::html::HTMLElement& printExpression (choc::html::HTMLElement& parent,
                                              const SourceCodeModel::Expression& e)
    {
        auto getClassForTypeSection = [] (SourceCodeModel::Expression::Section::Type t) -> const char*
        {
            if (t == SourceCodeModel::Expression::Section::Type::keyword)   return "keyword";
            if (t == SourceCodeModel::Expression::Section::Type::structure) return "struct_name";
            if (t == SourceCodeModel::Expression::Section::Type::primitive) return "primitive_type";

            SOUL_ASSERT (t == SourceCodeModel::Expression::Section::Type::text);
            return "typename_text";
        };

        for (auto& s : e.sections)
        {
            auto classID = getClassForTypeSection (s.type);

            if (s.type == SourceCodeModel::Expression::Section::Type::structure)
            {
                if (! s.referencedUID.empty())
                {
                    parent.addLink ("#" + s.referencedUID).setClass (classID).addContent (s.text);
                    continue;
                }
            }

            parent.addSpan (classID).addContent (s.text);
        }

        return parent;
    }